

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

int TVMFuncGetGlobal(char *name,TVMFunctionHandle *out)

{
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *__x;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *this;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_41);
  __x = &tvm::runtime::Registry::Get(&local_40)->body_;
  std::__cxx11::string::~string((string *)&local_40);
  if (__x == (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)0x0) {
    this = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)0x0;
  }
  else {
    this = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)operator_new(0x20)
    ;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function(this,__x);
  }
  *out = this;
  return 0;
}

Assistant:

int TVMFuncGetGlobal(const char *name, TVMFunctionHandle *out) {
  API_BEGIN();
  const tvm::runtime::PackedFunc *fp =
      tvm::runtime::Registry::Get(name);
  if (fp != nullptr) {
    *out = new tvm::runtime::PackedFunc(*fp); // NOLINT(*)
  } else {
    *out = nullptr;
  }
  API_END();
}